

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteFields<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Desc<google::protobuf::json_internal::UnparseProto3Type> *desc,bool *first)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  pointer ppFVar4;
  pointer ppFVar5;
  bool bVar6;
  Field pFVar7;
  size_t sVar8;
  ulong uVar9;
  undefined8 *puVar10;
  size_type __n;
  __normal_iterator<const_google::protobuf::json_internal::ResolverPool::Field_**,_std::vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
  __i;
  long lVar11;
  pointer ppFVar12;
  size_t i;
  size_t sVar13;
  pointer ppFVar14;
  string_view ws;
  StatusOr<bool> is_empty;
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  fields;
  Field<google::protobuf::json_internal::UnparseProto3Type> field;
  char *local_68;
  _Head_base<0UL,_char,_false> local_60;
  bool *local_58;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_50;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_40;
  
  fields.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (size_type)*(int *)((long)&(desc->raw_).field_0 + 0x10);
  local_58 = first;
  std::
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ::reserve(&fields,__n);
  for (sVar13 = 0;
      ppFVar5 = fields.
                super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ppFVar14 = fields.
                 super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                 ._M_impl.super__Vector_impl_data._M_start, __n != sVar13; sVar13 = sVar13 + 1) {
    pFVar7 = Proto3Type::FieldByIndex(desc,sVar13);
    field = pFVar7;
    sVar8 = UnparseProto3Type::GetSize(pFVar7,msg);
    if ((writer->options_).always_print_fields_with_no_presence == true) {
      if (((field->raw_->field_0)._impl_.cardinality_ == 3) ||
         (bVar6 = Proto3Type::IsImplicitPresence(field), sVar8 != 0 || bVar6)) {
LAB_0029e845:
        std::
        vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
        ::push_back(&fields,&field);
      }
    }
    else if (sVar8 != 0) goto LAB_0029e845;
  }
  ppFVar4 = fields.
            super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (fields.
      super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      fields.
      super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar11 = (long)fields.
                   super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)fields.
                   super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = lVar11 >> 3;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (fields.
               super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               fields.
               super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (ppFVar14,ppFVar5);
      ppFVar14 = fields.
                 super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar4 = fields.
                super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ppFVar12 = ppFVar14 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (ppFVar14,ppFVar12);
      for (; ppFVar14 = fields.
                        super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
          ppFVar4 = fields.
                    super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, ppFVar12 != ppFVar5;
          ppFVar12 = ppFVar12 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::json_internal::ResolverPool::Field_const**,std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (ppFVar12);
      }
    }
  }
  for (; ppFVar14 != ppFVar4; ppFVar14 = ppFVar14 + 1) {
    pFVar7 = *ppFVar14;
    if ((pFVar7->raw_->field_0)._impl_.cardinality_ == 3) {
LAB_0029e8e6:
      JsonWriter::WriteComma(writer,local_58);
      JsonWriter::NewLine(writer);
      if ((writer->options_).preserve_proto_field_names == true) {
        puVar10 = (undefined8 *)
                  ((ulong)(pFVar7->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                  );
        local_40.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str = (char *)*puVar10;
        local_40.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = puVar10[1];
        JsonWriter::
        Write<google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*>
                  (writer,&local_40,":");
      }
      else {
        puVar10 = (undefined8 *)
                  ((ulong)(pFVar7->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                  );
        is_empty.super_StatusOrData<bool>._8_8_ = *puVar10;
        is_empty.super_StatusOrData<bool>.field_0 =
             *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)(puVar10 + 1);
        puVar10 = (undefined8 *)
                  ((ulong)(pFVar7->raw_->field_0)._impl_.json_name_.tagged_ptr_.ptr_ &
                  0xfffffffffffffffc);
        pcVar2 = (char *)*puVar10;
        if ((((writer->options_).allow_legacy_syntax == true) &&
            ((byte)(*(byte *)is_empty.super_StatusOrData<bool>._8_8_ + 0xbf) < 0x1a)) &&
           (0x19 < (byte)(*pcVar2 + 0xbfU))) {
          cVar1 = *(char *)((long)&absl::lts_20240722::ascii_internal::kToUpper +
                           (ulong)*(byte *)is_empty.super_StatusOrData<bool>._8_8_);
          _field = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&is_empty,1,
                              0xffffffffffffffff);
          local_60._M_head_impl = cVar1;
          JsonWriter::
          Write<google::protobuf::json_internal::Quoted<char,std::basic_string_view<char,std::char_traits<char>>>,char_const*>
                    (writer,(Quoted<char,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &field,":");
        }
        else {
          local_50.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = puVar10[1];
          local_50.value.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str = pcVar2;
          JsonWriter::
          Write<google::protobuf::json_internal::Quoted<std::basic_string_view<char,std::char_traits<char>>>,char_const*>
                    (writer,&local_50,":");
        }
      }
      ws._M_str = " ";
      ws._M_len = 1;
      JsonWriter::Whitespace(writer,ws);
      bVar6 = Proto3Type::IsMap(pFVar7);
      if (bVar6) {
        WriteMap<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,pFVar7);
        goto LAB_0029eb0f;
      }
      if ((pFVar7->raw_->field_0)._impl_.cardinality_ == 3) {
        WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,pFVar7);
        goto LAB_0029eb0f;
      }
      sVar13 = UnparseProto3Type::GetSize(pFVar7,msg);
      if (sVar13 != 0) {
        (anonymous_namespace)::
        WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                  ((_anonymous_namespace_ *)this,writer,pFVar7,msg);
        goto LAB_0029eb0f;
      }
      if ((pFVar7->raw_->field_0)._impl_.kind_ != 10) {
        WriteSingular<google::protobuf::json_internal::UnparseProto3Type>(this,writer,pFVar7);
        goto LAB_0029eb0f;
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"null",4);
      *(undefined8 *)this = 1;
    }
    else {
      IsEmptyValue<google::protobuf::json_internal::UnparseProto3Type>
                ((anon_unknown_4 *)&is_empty,msg,pFVar7);
      absl::lts_20240722::Status::Status((Status *)this,(Status *)&is_empty);
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
                  (&is_empty.super_StatusOrData<bool>);
        if (is_empty.super_StatusOrData<bool>.field_1.data_ != true) {
          absl::lts_20240722::Status::~Status((Status *)&is_empty);
          goto LAB_0029e8e6;
        }
        *(undefined8 *)this = 1;
      }
      absl::lts_20240722::Status::~Status((Status *)&is_empty);
LAB_0029eb0f:
      if (*(long *)this != 1) goto LAB_0029eb2d;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
  }
  *(undefined8 *)this = 1;
LAB_0029eb2d:
  std::
  _Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                 );
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteFields(JsonWriter& writer, const Msg<Traits>& msg,
                         const Desc<Traits>& desc, bool& first) {
  std::vector<Field<Traits>> fields;
  size_t total = Traits::FieldCount(desc);
  fields.reserve(total);
  for (size_t i = 0; i < total; ++i) {
    Field<Traits> field = Traits::FieldByIndex(desc, i);

    bool has = Traits::GetSize(field, msg) > 0;

    if (writer.options().always_print_fields_with_no_presence) {
      has |= Traits::IsRepeated(field) || Traits::IsImplicitPresence(field);
    }

    if (has) {
      fields.push_back(field);
    }
  }

  // Add extensions *before* sorting.
  Traits::FindAndAppendExtensions(msg, fields);

  // Fields are guaranteed to be serialized in field number order.
  absl::c_sort(fields, [](const auto& a, const auto& b) {
    return Traits::FieldNumber(a) < Traits::FieldNumber(b);
  });

  for (auto field : fields) {
    RETURN_IF_ERROR(WriteField<Traits>(writer, msg, field, first));
  }

  return absl::OkStatus();
}